

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

void rlogin_size(Backend *be,int width,int height)

{
  undefined8 uVar1;
  size_t sVar2;
  undefined1 local_2c [5];
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  char b [12];
  Rlogin *rlogin;
  int height_local;
  int width_local;
  Backend *be_local;
  
  b._4_8_ = &be[-6].interactor;
  b[0] = '\0';
  b[1] = '\0';
  b[2] = '\0';
  b[3] = '\0';
  *(int *)((long)&be[-5].interactor + 4) = width;
  *(int *)&be[-4].vt = height;
  if ((*(Interactor **)b._4_8_ != (Interactor *)0x0) && (((ulong)be[-5].interactor & 0x10000) != 0))
  {
    _local_2c = CONCAT17((char)*(undefined4 *)((long)&be[-5].interactor + 4),
                         CONCAT16((char)((uint)*(undefined4 *)((long)&be[-5].interactor + 4) >> 8),
                                  0x7373ffff));
    uVar1 = _local_2c;
    _uStack_26 = SUB82(uVar1,6);
    _local_2c = CONCAT15((char)*(undefined4 *)&be[-4].vt,
                         CONCAT14((char)((uint)*(undefined4 *)&be[-4].vt >> 8),0x7373ffff));
    sVar2 = sk_write((Socket *)*(Interactor **)b._4_8_,local_2c,0xc);
    *(int *)(b._4_8_ + 0xc) = (int)sVar2;
  }
  return;
}

Assistant:

static void rlogin_size(Backend *be, int width, int height)
{
    Rlogin *rlogin = container_of(be, Rlogin, backend);
    char b[12] = { '\xFF', '\xFF', 0x73, 0x73, 0, 0, 0, 0, 0, 0, 0, 0 };

    rlogin->term_width = width;
    rlogin->term_height = height;

    if (rlogin->s == NULL || !rlogin->cansize)
        return;

    b[6] = rlogin->term_width >> 8;
    b[7] = rlogin->term_width & 0xFF;
    b[4] = rlogin->term_height >> 8;
    b[5] = rlogin->term_height & 0xFF;
    rlogin->bufsize = sk_write(rlogin->s, b, 12);
    return;
}